

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O0

int ShouldMergeBlock(uint8_t *data,size_t len,uint8_t *depths)

{
  size_t sVar1;
  byte bVar2;
  ulong uVar3;
  undefined4 uVar7;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  double local_860;
  double r;
  size_t total;
  size_t i;
  size_t histo [256];
  uint8_t *depths_local;
  size_t len_local;
  uint8_t *data_local;
  double local_20;
  double local_10;
  
  memset(&i,0,0x800);
  for (total = 0; total < len; total = total + 0x2b) {
    histo[(ulong)data[total] - 1] = histo[(ulong)data[total] - 1] + 1;
  }
  uVar3 = (len + 0x2a) / 0x2b;
  uVar7 = (undefined4)(uVar3 >> 0x20);
  if (uVar3 < 0x100) {
    local_10 = (double)kLog2Table[uVar3];
  }
  else {
    auVar4._8_4_ = uVar7;
    auVar4._0_8_ = uVar3;
    auVar4._12_4_ = 0x45300000;
    local_10 = log2((auVar4._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
  }
  auVar8._8_4_ = uVar7;
  auVar8._0_8_ = uVar3;
  auVar8._12_4_ = 0x45300000;
  local_860 = (local_10 + 0.5) *
              ((auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) + 200.0;
  for (total = 0; total < 0x100; total = total + 1) {
    sVar1 = histo[total - 1];
    auVar5._8_4_ = (int)(sVar1 >> 0x20);
    auVar5._0_8_ = sVar1;
    auVar5._12_4_ = 0x45300000;
    bVar2 = depths[total];
    uVar3 = histo[total - 1];
    if (uVar3 < 0x100) {
      local_20 = (double)kLog2Table[uVar3];
    }
    else {
      auVar6._8_4_ = (int)(uVar3 >> 0x20);
      auVar6._0_8_ = uVar3;
      auVar6._12_4_ = 0x45300000;
      local_20 = log2((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
    }
    local_860 = -((auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) *
                ((double)bVar2 + local_20) + local_860;
  }
  return (uint)(0.0 <= local_860);
}

Assistant:

static BROTLI_BOOL ShouldMergeBlock(
    const uint8_t* data, size_t len, const uint8_t* depths) {
  size_t histo[256] = { 0 };
  static const size_t kSampleRate = 43;
  size_t i;
  for (i = 0; i < len; i += kSampleRate) {
    ++histo[data[i]];
  }
  {
    const size_t total = (len + kSampleRate - 1) / kSampleRate;
    double r = (FastLog2(total) + 0.5) * (double)total + 200;
    for (i = 0; i < 256; ++i) {
      r -= (double)histo[i] * (depths[i] + FastLog2(histo[i]));
    }
    return TO_BROTLI_BOOL(r >= 0.0);
  }
}